

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_439a3::TestTestRunnerFixtureReporterNotifiedOfTestCount::RunImpl
          (TestTestRunnerFixtureReporterNotifiedOfTestCount *this)

{
  TestDetails *details;
  TestRunnerFixtureReporterNotifiedOfTestCountHelper fixtureHelper;
  TestRunnerFixtureReporterNotifiedOfTestCountHelper local_890;
  
  details = &(this->super_Test).m_details;
  TestRunnerFixture::TestRunnerFixture(&local_890.super_TestRunnerFixture);
  local_890.m_details = details;
  UnitTest::ExecuteTest<(anonymous_namespace)::TestRunnerFixtureReporterNotifiedOfTestCountHelper>
            (&local_890,details);
  UnitTest::TestRunner::~TestRunner(&local_890.super_TestRunnerFixture.runner);
  UnitTest::TestReporter::~TestReporter((TestReporter *)&local_890);
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, ReporterNotifiedOfTestCount)
{
    MockTest test1("test", true, false);
    MockTest test2("test", true, false);
    MockTest test3("test", true, false);
    list.Add(&test1);
    list.Add(&test2);
    list.Add(&test3);

	runner.RunTestsIf(list, NULL, True(), 0);
    CHECK_EQUAL(3, reporter.summaryTotalTestCount);
}